

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

int signo2(int A,int B)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = A >> 1;
  iVar1 = 3;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    uVar2 = uVar2 ^ (int)uVar2 >> 1;
  }
  uVar2 = uVar2 & B;
  uVar2 = uVar2 - ((uVar2 >> 3 & 0x11111111) + (uVar2 >> 2 & 0x33333333) + (uVar2 >> 1 & 0x77777777)
                  );
  return ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) % 0xff & 1;
}

Assistant:

int signo2(int A,int B)
{
	//int sig=1;
	//int tA2=((A>>tp)&(B>>tp));
	A>>=1;
	//B&=0xF;
	for(register int i=0;i<3;i++)
		A^=A>>1;
	return bits((A&B))&1;
}